

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.h
# Opt level: O1

SPxId __thiscall soplex::SPxSolverBase<double>::coId(SPxSolverBase<double> *this,int i)

{
  ulong uVar1;
  DataKey local_18;
  DataKey local_10;
  
  if (this->theRep == ROW) {
    local_18 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
               set.thekey[i];
    SPxColId::SPxColId((SPxColId *)&local_10,&local_18);
    uVar1 = 1;
  }
  else {
    local_18 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
               set.thekey[i];
    SPxRowId::SPxRowId((SPxRowId *)&local_10,&local_18);
    uVar1 = 0xffffffff;
  }
  return (SPxId)((ulong)local_10 & 0xffffffff00000000 | uVar1);
}

Assistant:

SPxId coId(int i) const
   {
      if(rep() == ROW)
      {
         SPxColId cid = SPxLPBase<R>::cId(i);
         return SPxId(cid);
      }
      else
      {
         SPxRowId rid = SPxLPBase<R>::rId(i);
         return SPxId(rid);
      }
   }